

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_scan_root_p_tree_multiple
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  double dVar1;
  int local_4c;
  bsc_step_t local_48;
  int local_44;
  bsc_step_t finished;
  bsc_size_t i;
  bsc_pid_t root_P;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t n_local;
  bsc_coll_params_t *params_local;
  bsc_group_t group_local;
  bsc_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    local_4c = bsp_nprocs();
  }
  else {
    local_4c = *group;
  }
  dVar1 = sqrt((double)local_4c);
  dVar1 = ceil(dVar1);
  local_48 = depends;
  for (local_44 = 0; local_44 < n; local_44 = local_44 + 1) {
    local_48 = bsc_scan_qtree_single
                         (depends,group,params[local_44].src,params[local_44].dst,
                          params[local_44].tmp,params[local_44].reducer,params[local_44].zero,
                          params[local_44].nmemb,params[local_44].size,(int)dVar1);
  }
  return local_48;
}

Assistant:

bsc_step_t bsc_scan_root_p_tree_multiple( bsc_step_t depends,
                      bsc_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs(), root_P = (bsc_pid_t) ceil(sqrt(P));
    bsc_size_t i;
    bsc_step_t finished = depends;
    (void) root;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_scan_qtree_single( depends, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, root_P );
    }

    return finished;
}